

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddKeyAnalogEvent(ImGuiIO *this,ImGuiKey key,bool down,float analog_value)

{
  ImGuiContext *pIVar1;
  ImGuiInputEvent *pIVar2;
  ImGuiKeyData *pIVar3;
  ImGuiKeyData *pIVar4;
  float *pfVar5;
  ImGuiInputEvent e;
  
  pIVar1 = GImGui;
  if ((key != ImGuiKey_KeysData_OFFSET) && (this->AppAcceptingEvents == true)) {
    this->BackendUsingLegacyKeyArrays = '\0';
    if (key - ImGuiKey_GamepadStart < 0x18) {
      this->BackendUsingLegacyNavInputArray = false;
    }
    pIVar2 = FindLatestInputEvent(ImGuiInputEventType_Key,key);
    pIVar3 = ImGui::GetKeyData(key);
    pIVar4 = (ImGuiKeyData *)((long)&pIVar2->field_2 + 4);
    if (pIVar2 == (ImGuiInputEvent *)0x0) {
      pIVar4 = pIVar3;
    }
    if (pIVar4->Down == down) {
      pfVar5 = &(pIVar2->field_2).Key.AnalogValue;
      if (pIVar2 == (ImGuiInputEvent *)0x0) {
        pfVar5 = &pIVar3->AnalogValue;
      }
      if ((*pfVar5 == analog_value) && (!NAN(*pfVar5) && !NAN(analog_value))) {
        return;
      }
    }
    e.AddedByTestEngine = false;
    e._21_3_ = 0;
    e.Type = ImGuiInputEventType_Key;
    e.Source = (key - ImGuiKey_GamepadStart < 0x18) + ImGuiInputSource_Keyboard;
    e.field_2._5_3_ = 0;
    e.field_2.MouseButton.Down = down;
    e.field_2.Key.AnalogValue = analog_value;
    e.field_2.Key.Key = key;
    ImVector<ImGuiInputEvent>::push_back(&pIVar1->InputEventsQueue,&e);
  }
  return;
}

Assistant:

void ImGuiIO::AddKeyAnalogEvent(ImGuiKey key, bool down, float analog_value)
{
    //if (e->Down) { IMGUI_DEBUG_LOG_IO("AddKeyEvent() Key='%s' %d, NativeKeycode = %d, NativeScancode = %d\n", ImGui::GetKeyName(e->Key), e->Down, e->NativeKeycode, e->NativeScancode); }
    if (key == ImGuiKey_None || !AppAcceptingEvents)
        return;
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(ImGui::IsNamedKeyOrModKey(key)); // Backend needs to pass a valid ImGuiKey_ constant. 0..511 values are legacy native key codes which are not accepted by this API.
    IM_ASSERT(!ImGui::IsAliasKey(key)); // Backend cannot submit ImGuiKey_MouseXXX values they are automatically inferred from AddMouseXXX() events.

    // Verify that backend isn't mixing up using new io.AddKeyEvent() api and old io.KeysDown[] + io.KeyMap[] data.
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT((BackendUsingLegacyKeyArrays == -1 || BackendUsingLegacyKeyArrays == 0) && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    if (BackendUsingLegacyKeyArrays == -1)
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            IM_ASSERT(KeyMap[n] == -1 && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    BackendUsingLegacyKeyArrays = 0;
#endif
    if (ImGui::IsGamepadKey(key))
        BackendUsingLegacyNavInputArray = false;

    // Filter duplicate (in particular: key mods and gamepad analog values are commonly spammed)
    const ImGuiInputEvent* latest_event = FindLatestInputEvent(ImGuiInputEventType_Key, (int)key);
    const ImGuiKeyData* key_data = ImGui::GetKeyData(key);
    const bool latest_key_down = latest_event ? latest_event->Key.Down : key_data->Down;
    const float latest_key_analog = latest_event ? latest_event->Key.AnalogValue : key_data->AnalogValue;
    if (latest_key_down == down && latest_key_analog == analog_value)
        return;

    // Add event
    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Key;
    e.Source = ImGui::IsGamepadKey(key) ? ImGuiInputSource_Gamepad : ImGuiInputSource_Keyboard;
    e.Key.Key = key;
    e.Key.Down = down;
    e.Key.AnalogValue = analog_value;
    g.InputEventsQueue.push_back(e);
}